

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  Result RVar1;
  char *format;
  uint uVar2;
  uint local_34;
  uint32_t local_30;
  uint32_t initial;
  uint32_t max;
  uint32_t flags;
  
  initial = 0;
  RVar1 = ReadS32Leb128(this,&initial,"table elem type");
  if (RVar1.enum_ != Error) {
    *out_elem_type = initial;
    if (initial == 0xfffffff0) {
      local_30 = 0;
      RVar1 = ReadU32Leb128(this,&initial,"table flags");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      RVar1 = ReadU32Leb128(this,&local_34,"table initial elem count");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      if ((initial & 2) == 0) {
        uVar2 = initial & 1;
        if (uVar2 == 0) {
          local_30 = 0;
        }
        else {
          RVar1 = ReadU32Leb128(this,&local_30,"table max elem count");
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          if (local_30 < local_34) {
            format = "table initial elem count must be <= max elem count";
            goto LAB_00f2d2e0;
          }
        }
        out_elem_limits->has_max = SUB41(uVar2,0);
        out_elem_limits->initial = (ulong)local_34;
        out_elem_limits->max = (ulong)local_30;
        return (Result)Ok;
      }
      format = "tables may not be shared";
LAB_00f2d2e0:
      PrintError(this,format);
      return (Result)Error;
    }
    PrintError(this,"table elem type must by anyfunc");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadType(out_elem_type, "table elem type"));
  ERROR_UNLESS(*out_elem_type == Type::Anyfunc,
               "table elem type must by anyfunc");

  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "table flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  ERROR_UNLESS(!is_shared, "tables may not be shared");
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
    ERROR_UNLESS(initial <= max,
                 "table initial elem count must be <= max elem count");
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}